

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O0

REF_STATUS ref_grid_free(REF_GRID ref_grid)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_CELL ref_cell;
  REF_INT group;
  REF_GRID ref_grid_local;
  
  if (ref_grid == (REF_GRID)0x0) {
    return 2;
  }
  if (ref_grid->interp != (REF_INTERP)0x0) {
    uVar1 = ref_grid_free(ref_grid->interp->from_grid);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",199,
             "ref_grid_free",(ulong)uVar1,"free cached background grid");
      return uVar1;
    }
    uVar1 = ref_interp_free(ref_grid->interp);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",200,
             "ref_grid_free",(ulong)uVar1,"interp free");
      return uVar1;
    }
  }
  ref_grid_local._4_4_ = ref_adapt_free(ref_grid->adapt);
  if (ref_grid_local._4_4_ == 0) {
    ref_grid_local._4_4_ = ref_gather_free(ref_grid->gather);
    if (ref_grid_local._4_4_ == 0) {
      ref_grid_local._4_4_ = ref_geom_free(ref_grid->geom);
      if (ref_grid_local._4_4_ == 0) {
        ref_cell._4_4_ = 0;
        _ref_private_macro_code_rss_1 = ref_grid->cell[0];
        while (ref_cell._4_4_ < 0x10) {
          uVar1 = ref_cell_free(_ref_private_macro_code_rss_1);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   0xd0,"ref_grid_free",(ulong)uVar1,"cell free");
            return uVar1;
          }
          ref_cell._4_4_ = ref_cell._4_4_ + 1;
          _ref_private_macro_code_rss_1 = ref_grid->cell[ref_cell._4_4_];
        }
        ref_grid_local._4_4_ = ref_node_free(ref_grid->node);
        if (ref_grid_local._4_4_ == 0) {
          ref_grid_local._4_4_ = ref_mpi_free(ref_grid->mpi);
          if (ref_grid_local._4_4_ == 0) {
            if (ref_grid != (REF_GRID)0x0) {
              free(ref_grid);
            }
            ref_grid_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   0xd4,"ref_grid_free",(ulong)ref_grid_local._4_4_,"mpi free");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                 0xd3,"ref_grid_free",(ulong)ref_grid_local._4_4_,"node free");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0xcd
               ,"ref_grid_free",(ulong)ref_grid_local._4_4_,"geom free");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0xcc,
             "ref_grid_free",(ulong)ref_grid_local._4_4_,"gather free");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0xcb,
           "ref_grid_free",(ulong)ref_grid_local._4_4_,"adapt free");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_grid_free(REF_GRID ref_grid) {
  REF_INT group;
  REF_CELL ref_cell;

  if (NULL == (void *)ref_grid) return REF_NULL;

  if (NULL != (void *)ref_grid_interp(ref_grid)) {
    RSS(ref_grid_free(ref_interp_from_grid(ref_grid_interp(ref_grid))),
        "free cached background grid");
    RSS(ref_interp_free(ref_grid->interp), "interp free");
  }

  RSS(ref_adapt_free(ref_grid->adapt), "adapt free");
  RSS(ref_gather_free(ref_grid_gather(ref_grid)), "gather free");
  RSS(ref_geom_free(ref_grid_geom(ref_grid)), "geom free");

  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    RSS(ref_cell_free(ref_cell), "cell free");
  }

  RSS(ref_node_free(ref_grid_node(ref_grid)), "node free");
  RSS(ref_mpi_free(ref_grid_mpi(ref_grid)), "mpi free");

  ref_free(ref_grid);
  return REF_SUCCESS;
}